

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ListLambdaBindData::Deserialize(Deserializer *deserializer,ScalarFunction *param_2)

{
  _Head_base<0UL,_duckdb::ListLambdaBindData_*,_false> _Var1;
  bool has_index;
  bool has_initial;
  long *local_40;
  undefined1 local_38 [8];
  _Head_base<0UL,_duckdb::ListLambdaBindData_*,_false> local_30;
  LogicalType return_type;
  
  Deserializer::ReadProperty<duckdb::LogicalType>
            (&return_type,(Deserializer *)param_2,100,"return_type");
  local_40 = (long *)0x0;
  Deserializer::
  ReadPropertyWithExplicitDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((Deserializer *)local_38,(field_id_t)param_2,(char *)0x65,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             "lambda_expr");
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 8))();
  }
  local_40 = (long *)0x0;
  has_index = Deserializer::ReadProperty<bool>((Deserializer *)param_2,0x66,"has_index");
  has_initial = Deserializer::ReadProperty<bool>((Deserializer *)param_2,0x67,"has_initial");
  make_uniq<duckdb::ListLambdaBindData,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,bool&,bool&>
            ((duckdb *)&local_30,&return_type,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             local_38,&has_index,&has_initial);
  _Var1._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (ListLambdaBindData *)0x0;
  deserializer->_vptr_Deserializer = (_func_int **)_Var1._M_head_impl;
  ::std::unique_ptr<duckdb::ListLambdaBindData,_std::default_delete<duckdb::ListLambdaBindData>_>::
  ~unique_ptr((unique_ptr<duckdb::ListLambdaBindData,_std::default_delete<duckdb::ListLambdaBindData>_>
               *)&local_30);
  if ((__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
      local_38 != (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0) {
    (**(code **)(*(_func_int **)local_38 + 8))();
  }
  LogicalType::~LogicalType(&return_type);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

unique_ptr<FunctionData> ListLambdaBindData::Deserialize(Deserializer &deserializer, ScalarFunction &) {
	auto return_type = deserializer.ReadProperty<LogicalType>(100, "return_type");
	auto lambda_expr = deserializer.ReadPropertyWithExplicitDefault<unique_ptr<Expression>>(101, "lambda_expr",
	                                                                                        unique_ptr<Expression>());
	auto has_index = deserializer.ReadProperty<bool>(102, "has_index");
	auto has_initial = deserializer.ReadProperty<bool>(103, "has_initial");
	return make_uniq<ListLambdaBindData>(return_type, std::move(lambda_expr), has_index, has_initial);
}